

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O2

void __thiscall SPTest_OrderVarsByStage_Test::TestBody(SPTest_OrderVarsByStage_Test *this)

{
  SuffixHandler<int> SVar1;
  _func_int *message;
  char *pcVar2;
  StringRef name;
  AssertHelper local_638;
  BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  local_630;
  AssertionResult gtest_ar_1;
  Type local_60c;
  SPAdapter sp;
  TestBasicProblem p;
  
  TestBasicProblem::TestBasicProblem(&p,2,1);
  local_630.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (BasicProblem<mp::BasicProblemParams<int>_> *)
       CONCAT44(local_630.
                super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                problem_._4_4_,1);
  gtest_ar_1._0_8_ = &p;
  gtest_ar_1.message_.ptr_._0_4_ = 1;
  local_638.data_._0_4_ =
       mp::BasicProblem<mp::BasicProblemParams<int>_>::
       BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       ::type((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               *)&gtest_ar_1);
  testing::internal::CmpHelperEQ<mp::var::Type,mp::var::Type>
            ((internal *)&sp,"mp::var::INTEGER","p.var(1).type()",(Type *)&local_630,
             (Type *)&local_638);
  if ((char)sp.problem_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (sp.factory_._vptr_BasicExprFactory == (_func_int **)0x0) {
      message = (_func_int *)0x15989b;
    }
    else {
      message = *sp.factory_._vptr_BasicExprFactory;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x154,
               (char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_630,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_630);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sp.factory_);
  (p.super_TestProblem.super_ColProblem.super_Problem.vars_.
   super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
   ._M_impl.super__Vector_impl_data._M_start)->lb = 42.0;
  name.size_ = 5;
  name.data_ = "stage";
  SVar1 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<int>
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)&p,name,0);
  **(undefined4 **)((long)SVar1.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ + 0x18) = 2;
  mp::SPAdapter::SPAdapter(&sp,(ColProblem *)&p);
  local_638.data_._0_4_ = 1;
  local_630.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       *sp.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_60c = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::type(&local_630);
  testing::internal::CmpHelperEQ<mp::var::Type,mp::var::Type>
            ((internal *)&gtest_ar_1,"mp::var::INTEGER","sp.var(0).type()",(Type *)&local_638,
             &local_60c);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_630);
    if ((undefined8 *)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x158,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_638,(Message *)&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_630);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  local_638.data_._0_4_ = 0;
  local_630.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       sp.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  local_60c = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::type(&local_630);
  testing::internal::CmpHelperEQ<mp::var::Type,mp::var::Type>
            ((internal *)&gtest_ar_1,"mp::var::CONTINUOUS","sp.var(1).type()",(Type *)&local_638,
             &local_60c);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_630);
    if ((undefined8 *)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x159,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_638,(Message *)&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_630);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  local_638.data_._0_4_ = 0x2a;
  local_630.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       *(BasicProblem<mp::BasicProblemParams<int>_> **)
        (*(long *)(CONCAT71(sp.problem_._1_7_,(char)sp.problem_) + 0x168) +
        (long)sp.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[1] * 0x10);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&gtest_ar_1,"42","sp.var(1).lb()",(int *)&local_638,(double *)&local_630);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_630);
    if ((undefined8 *)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x15a,
               pcVar2);
    testing::internal::AssertHelper::operator=(&local_638,(Message *)&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_630);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  mp::SPAdapter::~SPAdapter(&sp);
  mp::ColProblem::~ColProblem((ColProblem *)&p);
  return;
}

Assistant:

TEST(SPTest, OrderVarsByStage) {
  TestBasicProblem p(2, 1);
  EXPECT_EQ(mp::var::INTEGER, p.var(1).type());
  p.var(0).set_lb(42);
  p.AddIntSuffix("stage", mp::suf::VAR, 1).SetValue(0, 2);
  mp::SPAdapter sp(p);
  EXPECT_EQ(mp::var::INTEGER, sp.var(0).type());
  EXPECT_EQ(mp::var::CONTINUOUS, sp.var(1).type());
  EXPECT_EQ(42, sp.var(1).lb());
}